

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
AddBotsIRCCommand::trigger
          (AddBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 uVar1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  Channel *pCVar2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  int base;
  char *pcVar6;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string local_1f0;
  __sv_type local_1d0;
  __sv_type local_1c0;
  string local_1b0;
  size_type local_190;
  size_t base_length;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  int local_14c;
  undefined1 local_148 [4];
  TeamType team;
  string cmd;
  char *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d8 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  int amount;
  size_t local_a8;
  char *local_a0;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_70 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_58;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_48;
  long local_40;
  Channel *chan;
  IRC_Bot *source_local;
  AddBotsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (AddBotsIRCCommand *)nick._M_len;
  pcVar6 = channel._M_str;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)channel._M_len;
  pcVar7 = pcVar6;
  local_48 = pcVar6;
  chan = (Channel *)source;
  source_local = (IRC_Bot *)this;
  nick_local._M_str = (char *)servers;
  local_40 = Jupiter::IRC::Client::getChannel(source,servers,pcVar6);
  base = (int)pcVar7;
  if (local_40 == 0) {
    return;
  }
  RenX::getCore();
  Jupiter::IRC::Client::getChannel(chan,nick_local._M_str,pcVar6);
  Jupiter::IRC::Client::Channel::getType();
  RenX::Core::getServers((int)local_70);
  local_58 = local_70;
  bVar3 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_58);
  pcVar7 = nick_local._M_str;
  pCVar2 = chan;
  if (bVar3) {
    bVar8 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
    local_a8 = bVar8._M_len;
    local_a0 = bVar8._M_str;
    Jupiter::IRC::Client::sendMessage(pCVar2,pcVar7,pcVar6,local_a8,local_a0);
    goto LAB_00153a13;
  }
  split_parameters.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  local_e8._M_len = parameters._M_len;
  local_e8._M_str = parameters._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8," \t");
  jessilib::
  word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_d8,&local_e8,&local_f8);
  bVar3 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_d8);
  if (bVar3) {
LAB_0015370d:
    std::__cxx11::string::string((string *)local_148);
    local_14c = 3;
    sVar5 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_d8);
    if (1 < sVar5) {
      pvVar4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)local_d8,1);
      local_14c = RenX::getTeam(pvVar4->_M_len,pvVar4->_M_str);
    }
    if (local_14c == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "addredbots ");
    }
    else if (local_14c == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "addbluebots ");
    }
    else if (local_14c - 2U < 2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 "addbots ");
    }
    this_00 = local_58;
    __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_58);
    server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
    while (bVar3 = __gnu_cxx::
                   operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                       *)&server), ((bVar3 ^ 0xffU) & 1) != 0) {
      base_length = (size_t)__gnu_cxx::
                            __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                            ::operator*(&__end1);
      local_190 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148);
      if (*(long *)base_length != 0) {
        string_printf_abi_cxx11_
                  (&local_1b0,"%u",
                   (ulong)split_parameters.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   &local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        uVar1 = *(undefined8 *)base_length;
        local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_148);
        RenX::Server::send(uVar1,local_1c0._M_len,local_1c0._M_str);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   local_190,0xffffffffffffffff);
      }
      uVar1 = *(undefined8 *)base_length;
      string_printf_abi_cxx11_
                (&local_1f0,"%u bots have been added to the server.",
                 (ulong)split_parameters.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f0);
      RenX::Server::sendMessage(uVar1,local_1d0._M_len,local_1d0._M_str);
      std::__cxx11::string::~string((string *)&local_1f0);
      __gnu_cxx::
      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    pvVar4 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::front((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_d8);
    bVar8._M_str = (char *)0x0;
    bVar8._M_len = (size_t)pvVar4->_M_str;
    split_parameters.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Jupiter::asInt<char>((Jupiter *)pvVar4->_M_len,bVar8,base);
    pcVar7 = nick_local._M_str;
    pCVar2 = chan;
    if (split_parameters.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_0015370d;
    join_0x00000010_0x00000000_ =
         sv("Error: Invalid amount entered. Amount must be a positive integer.",0x41);
    Jupiter::IRC::Client::sendMessage(pCVar2,pcVar7,pcVar6,cmd.field_2._8_8_,local_120);
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_d8);
LAB_00153a13:
  std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_70);
  return;
}

Assistant:

void AddBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(source->getChannel(channel)->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	int amount = 1;
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.empty()) {
		amount = Jupiter::asInt(split_parameters.front());
		if (amount == 0) {
			source->sendMessage(channel, "Error: Invalid amount entered. Amount must be a positive integer."sv);
			return;
		}
	}

	std::string cmd;
	RenX::TeamType team = RenX::TeamType::None;
	if (split_parameters.size() >= 2) {
		team = RenX::getTeam(split_parameters[1]);
	}

	switch (team) {
	case RenX::TeamType::GDI:
		cmd = "addredbots ";
		break;
	case RenX::TeamType::Nod:
		cmd = "addbluebots ";
		break;
	case RenX::TeamType::None:
	case RenX::TeamType::Other:
		cmd = "addbots ";
		break;
	}

	for (const auto& server : servers) {
		size_t base_length = cmd.size();
		if (server != nullptr) {
			cmd += string_printf("%u", amount);
			server->send(cmd);
			cmd.erase(base_length);
		}
		server->sendMessage(string_printf("%u bots have been added to the server.", amount));
	}
}